

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::RawMessageSet::Clear(RawMessageSet *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
            ((RepeatedPtrFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RawMessageSet::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.RawMessageSet)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.item_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}